

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

monst * newmonst(int extyp,int namelen)

{
  monst *__s;
  int local_1c;
  int xlen;
  monst *mon;
  int namelen_local;
  int extyp_local;
  
  switch(extyp) {
  case 1:
    local_1c = 6;
    break;
  case 2:
    local_1c = 1;
    break;
  case 3:
    local_1c = 0x24;
    break;
  case 4:
    local_1c = 0xcf0;
    break;
  case 5:
    local_1c = 0x144;
    break;
  default:
    local_1c = 0;
  }
  __s = (monst *)malloc((long)namelen + 0x78 + (long)local_1c);
  memset(__s,0,(long)namelen + 0x78 + (long)local_1c);
  __s->mxtyp = (uchar)extyp;
  __s->mxlth = (short)local_1c;
  __s->mnamelth = (uchar)namelen;
  return __s;
}

Assistant:

struct monst *newmonst(int extyp, int namelen)
{
	struct monst *mon;
	int xlen;
	
	switch (extyp) {
	    case MX_EMIN: xlen = sizeof(struct emin); break;
	    case MX_EPRI: xlen = sizeof(struct epri); break;
	    case MX_EGD:  xlen = sizeof(struct egd);  break;
	    case MX_ESHK: xlen = sizeof(struct eshk); break;
	    case MX_EDOG: xlen = sizeof(struct edog); break;
	    default:      xlen = 0; break;
	}
	
	mon = malloc(sizeof(struct monst) + namelen + xlen);
	memset(mon, 0, sizeof(struct monst) + namelen + xlen);
	mon->mxtyp = extyp;
	mon->mxlth = xlen;
	mon->mnamelth = namelen;
	
	return mon;
}